

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation
          (cmGeneratorTarget *this,string *config,LinkInterfaceFor implFor,bool secondPass)

{
  bool bVar1;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  cmLinkImplementation *this_01;
  cmLinkImplementation local_d8;
  
  bVar1 = cmTarget::CanCompileSources(this->Target);
  if (bVar1) {
    if (implFor == Usage) {
      this_00 = &GetHeadToLinkImplementationUsageRequirementsMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    else {
      this_00 = &GetHeadToLinkImplementationMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    local_d8.super_cmLinkImplementationLibraries.Libraries.
    super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    this_01 = &std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
               ::operator[](this_00,(key_type *)&local_d8)->super_cmLinkImplementation;
    if (secondPass) {
      memset(&local_d8,0,0xa8);
      local_d8.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
      local_d8.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d8.LanguageRuntimeLibraries._M_h._M_element_count = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_d8.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_d8.HadLinkLanguageSensitiveCondition = false;
      local_d8._161_3_ = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_buckets =
           &local_d8.LanguageRuntimeLibraries._M_h._M_single_bucket;
      cmLinkImplementation::operator=(this_01,&local_d8);
      *(undefined2 *)&this_01->field_0xa1 = local_d8._161_2_;
      this_01->field_0xa3 = local_d8._163_1_;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_d8.LanguageRuntimeLibraries._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8.Languages);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                (&local_d8.super_cmLinkImplementationLibraries.WrongConfigLibraries);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                (&local_d8.super_cmLinkImplementationLibraries.Objects);
      std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
                ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)&local_d8);
    }
    if (this_01->field_0xa1 == '\0') {
      this_01->field_0xa1 = 1;
      ComputeLinkImplementationLibraries
                (this,config,(cmOptionalLinkImplementation *)this_01,this,implFor);
    }
    if (this_01->field_0xa2 == '\0') {
      this_01->field_0xa2 = 1;
      ComputeLinkImplementationLanguages(this,config,(cmOptionalLinkImplementation *)this_01);
      ComputeLinkImplementationRuntimeLibraries(this,config,(cmOptionalLinkImplementation *)this_01)
      ;
    }
  }
  else {
    this_01 = (cmLinkImplementation *)0x0;
  }
  return this_01;
}

Assistant:

const cmLinkImplementation* cmGeneratorTarget::GetLinkImplementation(
  const std::string& config, LinkInterfaceFor implFor, bool secondPass) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));
  cmOptionalLinkImplementation& impl = hm[this];
  if (secondPass) {
    impl = cmOptionalLinkImplementation();
  }
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, this, implFor);
  }
  if (!impl.LanguagesDone) {
    impl.LanguagesDone = true;
    this->ComputeLinkImplementationLanguages(config, impl);
    this->ComputeLinkImplementationRuntimeLibraries(config, impl);
  }
  return &impl;
}